

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O2

int fetch_all_stops_db(feed_db_t *db,stop_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  stop_t *psVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  double local_4b8;
  double local_4b0;
  stop_t record;
  char qr [190];
  
  uVar2 = count_rows_db(db,"stops");
  if (0 < (int)uVar2) {
    memcpy(qr,
           "SELECT stop_id, stop_code, stop_name, stop_desc,stop_lat, stop_lon,zone_id, stop_url,location_type, parent_station, stop_timezone, wheelchair_boarding, level_id, platform_code FROM `stops`;"
           ,0xbe);
    sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
    psVar4 = (stop_t *)malloc((ulong)uVar2 * 0x3b0);
    *records = psVar4;
    uVar1 = 0xffffffff;
    if (psVar4 != (stop_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(stmt);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_stop(&record);
        puVar5 = sqlite3_column_text(stmt,0);
        strcpy(record.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,1);
        strcpy(record.code,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,2);
        strcpy(record.name,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,3);
        strcpy(record.desc,(char *)puVar5);
        local_4b0 = sqlite3_column_double(stmt,4);
        record.lat = (longdouble)local_4b0;
        local_4b8 = sqlite3_column_double(stmt,5);
        record.lon = (longdouble)local_4b8;
        puVar5 = sqlite3_column_text(stmt,6);
        strcpy(record.zone_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,7);
        strcpy(record.url,(char *)puVar5);
        record.location_type = sqlite3_column_int(stmt,8);
        puVar5 = sqlite3_column_text(stmt,9);
        strcpy(record.parent_station,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,10);
        strcpy(record.timezone,(char *)puVar5);
        record.wheelchair_boarding = sqlite3_column_int(stmt,0xb);
        puVar5 = sqlite3_column_text(stmt,0xc);
        strcpy(record.level_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,0xd);
        strcpy(record.platform_code,(char *)puVar5);
        memcpy((*records)->id + lVar6,&record,0x3b0);
        lVar6 = lVar6 + 0x3b0;
      } while ((ulong)uVar2 * 0x3b0 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(stmt);
  }
  return uVar2;
}

Assistant:

int fetch_all_stops_db(feed_db_t *db, stop_t **records) {

    stop_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "stops");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "stop_id, stop_code, stop_name, stop_desc,"
                    "stop_lat, stop_lon,"
                    "zone_id, stop_url,"
                    "location_type, parent_station, stop_timezone, wheelchair_boarding, "
                    "level_id, platform_code "
                "FROM `stops`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_stop(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.code, sqlite3_column_text(stmt, 1));
        strcpy(record.name, sqlite3_column_text(stmt, 2));
        strcpy(record.desc, sqlite3_column_text(stmt, 3));
        record.lat = sqlite3_column_double(stmt, 4);
        record.lon = sqlite3_column_double(stmt, 5);
        strcpy(record.zone_id, sqlite3_column_text(stmt, 6));
        strcpy(record.url, sqlite3_column_text(stmt, 7));
        record.location_type = (location_type_t)sqlite3_column_int(stmt, 8);
        strcpy(record.parent_station, sqlite3_column_text(stmt, 9));
        strcpy(record.timezone, sqlite3_column_text(stmt, 10));
        record.wheelchair_boarding = (wheelchair_boarding_t)sqlite3_column_int(stmt, 11);
        strcpy(record.level_id, sqlite3_column_text(stmt, 12));
        strcpy(record.platform_code, sqlite3_column_text(stmt, 13));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}